

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

UCollationResult __thiscall
icu_63::RuleBasedCollator::doCompare
          (RuleBasedCollator *this,uint8_t *left,int32_t leftLength,uint8_t *right,
          int32_t rightLength,UErrorCode *errorCode)

{
  uint8_t *puVar1;
  byte bVar2;
  int32_t options;
  CollationSettings *settings;
  CollationData *pCVar3;
  uint8_t uVar4;
  byte numeric;
  UBool UVar5;
  uint uVar6;
  UCollationResult UVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  int32_t leftLength_00;
  int rightLength_00;
  UTF8CollationIterator rightIter;
  UTF8CollationIterator leftIter;
  uint local_464;
  byte local_45d;
  uint local_45c;
  UErrorCode *local_458;
  undefined1 local_450 [40];
  UTrie2 *local_428;
  CollationData *local_420;
  undefined4 local_418;
  long *local_410;
  undefined4 local_408;
  undefined1 local_404;
  long local_400 [36];
  int32_t local_2e0;
  SkippedState *local_2d8;
  int32_t local_2d0;
  byte local_2cc;
  uint8_t *local_2c8;
  uint local_2c0;
  uint local_2bc;
  long local_2b8;
  int32_t local_2b0;
  undefined1 local_2ac;
  Normalizer2Impl *local_2a8;
  Replaceable local_2a0;
  undefined1 local_298 [88];
  undefined1 local_240 [40];
  UTrie2 *local_218;
  CollationData *local_210;
  undefined4 local_208;
  long *local_200;
  undefined4 local_1f8;
  undefined1 local_1f4;
  long local_1f0 [36];
  int32_t local_d0;
  SkippedState *local_c8;
  int32_t local_c0;
  byte local_bc;
  uint8_t *local_b8;
  uint local_b0;
  int32_t local_ac;
  long local_a8;
  int32_t local_a0;
  undefined1 local_9c;
  Normalizer2Impl *local_98;
  Replaceable local_90;
  undefined1 local_88 [88];
  
  if (left == right && leftLength == rightLength) {
    return UCOL_EQUAL;
  }
  local_464 = 0;
  if (leftLength < 0) {
    uVar4 = *left;
    if (uVar4 == *right) {
      lVar9 = 1;
      do {
        if (uVar4 == '\0') {
          return UCOL_EQUAL;
        }
        local_464 = (uint)lVar9;
        uVar4 = left[lVar9];
        puVar1 = right + lVar9;
        lVar9 = lVar9 + 1;
      } while (uVar4 == *puVar1);
    }
  }
  else {
    lVar9 = 0;
    if (leftLength != 0) {
      lVar9 = 0;
      do {
        if ((rightLength == lVar9) || (left[lVar9] != right[lVar9])) goto LAB_00221524;
        lVar9 = lVar9 + 1;
        local_464 = (uint)lVar9;
      } while (leftLength != local_464);
    }
    if ((int)lVar9 == rightLength) {
      return UCOL_EQUAL;
    }
  }
LAB_00221524:
  lVar9 = (long)(int)local_464;
  if ((0 < lVar9) &&
     (((local_464 != leftLength && ((char)left[lVar9] < -0x40)) ||
      ((local_464 != rightLength && ((char)right[lVar9] < -0x40)))))) {
    uVar6 = 1;
    if ((int)local_464 < 1) {
      uVar6 = local_464;
    }
    uVar10 = local_464;
    uVar8 = local_464;
    do {
      uVar8 = uVar8 - 1;
      local_464 = uVar6 - 1;
      if ((int)uVar10 < 2) break;
      local_464 = uVar10 - 1;
      uVar10 = local_464;
    } while ((char)left[uVar8] < -0x40);
  }
  numeric = (byte)this->settings->options >> 1 & 1;
  uVar11 = (ulong)local_464;
  local_45d = numeric;
  local_45c = rightLength;
  local_458 = errorCode;
  if ((int)local_464 < 1) goto LAB_0022166c;
  if (local_464 == leftLength) {
LAB_002215dd:
    lVar9 = (long)(int)local_464;
    if (local_464 == local_45c) goto LAB_0022166c;
    bVar2 = right[lVar9];
    uVar6 = (uint)bVar2;
    if ((char)bVar2 < '\0') {
      uVar11 = lVar9 + 1;
      uVar6 = 0xfffd;
      if ((uint)uVar11 != local_45c) {
        if (bVar2 < 0xe0) {
          if (0xc1 < bVar2) {
            uVar8 = bVar2 & 0x1f;
LAB_00221ce4:
            if ((byte)(right[(int)uVar11] ^ 0x80) < 0x40) {
              uVar6 = uVar8 << 6 | right[(int)uVar11] ^ 0x80;
            }
          }
        }
        else if (bVar2 < 0xf0) {
          uVar8 = bVar2 & 0xf;
          if (((byte)" 000000000000\x1000"[uVar8] >> (right[uVar11] >> 5) & 1) != 0) {
            bVar13 = right[uVar11] & 0x3f;
LAB_00221c94:
            uVar10 = (int)uVar11 + 1;
            uVar11 = (ulong)uVar10;
            if (uVar10 != local_45c) {
              uVar8 = (uint)bVar13 | uVar8 << 6;
              goto LAB_00221ce4;
            }
          }
        }
        else if (bVar2 < 0xf5) {
          if (((((uint)(int)""[right[uVar11] >> 4] >> (bVar2 - 0xf0 & 0x1f) & 1) != 0) &&
              (uVar12 = lVar9 + 2, (uint)uVar12 != local_45c)) &&
             (bVar13 = right[uVar12] + 0x80, bVar13 < 0x40)) {
            uVar8 = right[uVar11] & 0x3f | (bVar2 - 0xf0) * 0x40;
            uVar11 = uVar12 & 0xffffffff;
            goto LAB_00221c94;
          }
        }
      }
    }
    UVar5 = CollationData::isUnsafeBackward(this->data,uVar6,numeric);
    if (UVar5 == '\0') goto LAB_0022166c;
  }
  else {
    bVar2 = left[uVar11];
    uVar6 = (uint)bVar2;
    if ((char)bVar2 < '\0') {
      uVar12 = uVar11 + 1;
      uVar6 = 0xfffd;
      if ((int)uVar12 != leftLength) {
        if (bVar2 < 0xe0) {
          if (0xc1 < bVar2) {
            uVar8 = bVar2 & 0x1f;
LAB_00221cb7:
            if ((byte)(left[uVar12 & 0xffffffff] ^ 0x80) < 0x40) {
              uVar6 = uVar8 << 6 | left[uVar12 & 0xffffffff] ^ 0x80;
            }
          }
        }
        else if (bVar2 < 0xf0) {
          uVar8 = bVar2 & 0xf;
          if (((byte)" 000000000000\x1000"[uVar8] >> (left[uVar12] >> 5) & 1) != 0) {
            bVar13 = left[uVar12] & 0x3f;
LAB_00221c4b:
            uVar10 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar10;
            if (uVar10 != leftLength) {
              uVar8 = (uint)bVar13 | uVar8 << 6;
              goto LAB_00221cb7;
            }
          }
        }
        else if (bVar2 < 0xf5) {
          if (((((uint)(int)""[left[uVar12] >> 4] >> (bVar2 - 0xf0 & 0x1f) & 1) != 0) &&
              (uVar11 = uVar11 + 2, (int)uVar11 != leftLength)) &&
             (bVar13 = left[uVar11] + 0x80, bVar13 < 0x40)) {
            uVar8 = left[uVar12] & 0x3f | (bVar2 - 0xf0) * 0x40;
            uVar12 = uVar11 & 0xffffffff;
            goto LAB_00221c4b;
          }
        }
      }
    }
    UVar5 = CollationData::isUnsafeBackward(this->data,uVar6,numeric);
    if (UVar5 == '\0') goto LAB_002215dd;
  }
  do {
    lVar9 = (long)(int)local_464;
    local_464 = local_464 - 1;
    bVar2 = left[lVar9 + -1];
    uVar6 = (uint)bVar2;
    if ((char)bVar2 < '\0') {
      uVar6 = utf8_prevCharSafeBody_63(left,0,(int32_t *)&local_464,(uint)bVar2,-3);
    }
    if ((int)local_464 < 1) break;
    UVar5 = CollationData::isUnsafeBackward(this->data,uVar6,numeric);
  } while (UVar5 != '\0');
LAB_0022166c:
  uVar6 = local_45c;
  options = this->settings->fastLatinOptions;
  UVar7 = ~UCOL_GREATER;
  if (((-1 < options) &&
      ((lVar9 = (long)(int)local_464, leftLength == local_464 || (left[lVar9] < 0xc6)))) &&
     ((local_45c == local_464 || (right[lVar9] < 0xc6)))) {
    if (leftLength < 0) {
      rightLength_00 = -1;
      leftLength_00 = -1;
    }
    else {
      leftLength_00 = leftLength - local_464;
      rightLength_00 = local_45c - local_464;
    }
    UVar7 = CollationFastLatin::compareUTF8
                      (this->data->fastLatinTable,this->settings->fastLatinPrimaries,options,
                       left + lVar9,leftLength_00,right + lVar9,rightLength_00);
  }
  if (UVar7 == ~UCOL_GREATER) {
    settings = this->settings;
    local_2c8 = right;
    local_b8 = left;
    local_ac = leftLength;
    if ((settings->options & 1) == 0) {
      local_450._16_8_ = this->data;
      local_240._32_8_ = &local_210;
      local_240._8_8_ = *(undefined8 *)local_450._16_8_;
      local_240._24_8_ = (ulong)(uint)local_240._28_4_ << 0x20;
      local_218 = (UTrie2 *)CONCAT35(local_218._5_3_,0x28);
      local_d0 = 0;
      local_c8 = (SkippedState *)0x0;
      local_c0 = -1;
      local_bc = local_45d;
      local_240._0_8_ = &PTR__UTF8CollationIterator_003d6af0;
      local_b0 = local_464;
      local_450._32_8_ = &local_420;
      local_450._8_8_ = *(undefined8 *)local_450._16_8_;
      local_450._24_8_ = (ulong)(uint)local_450._28_4_ << 0x20;
      local_428 = (UTrie2 *)CONCAT35(local_428._5_3_,0x28);
      local_2e0 = 0;
      local_2d8 = (SkippedState *)0x0;
      local_2d0 = -1;
      local_2cc = local_45d;
      local_450._0_8_ = &PTR__UTF8CollationIterator_003d6af0;
      local_2c0 = local_464;
      local_2bc = uVar6;
      local_240._16_8_ = local_450._16_8_;
      UVar7 = CollationCompare::compareUpToQuaternary
                        ((CollationIterator *)local_240,(CollationIterator *)local_450,settings,
                         local_458);
      UTF8CollationIterator::~UTF8CollationIterator((UTF8CollationIterator *)local_450);
      UTF8CollationIterator::~UTF8CollationIterator((UTF8CollationIterator *)local_240);
    }
    else {
      local_450._16_8_ = this->data;
      local_240._32_8_ = &local_210;
      local_240._8_8_ = *(undefined8 *)local_450._16_8_;
      local_240._24_8_ = (ulong)(uint)local_240._28_4_ << 0x20;
      local_218 = (UTrie2 *)CONCAT35(local_218._5_3_,0x28);
      local_d0 = 0;
      local_c8 = (SkippedState *)0x0;
      local_c0 = -1;
      local_bc = local_45d;
      local_b0 = local_464;
      local_240._0_8_ = &PTR__FCDUTF8CollationIterator_003d6a60;
      local_a8 = (ulong)local_464 << 0x20;
      local_98 = *(Normalizer2Impl **)(local_450._16_8_ + 0x30);
      local_90.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e6fd8;
      local_88._0_2_ = 2;
      local_450._32_8_ = &local_420;
      local_450._8_8_ = *(undefined8 *)local_450._16_8_;
      local_450._24_8_ = (ulong)(uint)local_450._28_4_ << 0x20;
      local_428 = (UTrie2 *)CONCAT35(local_428._5_3_,0x28);
      local_2e0 = 0;
      local_2d8 = (SkippedState *)0x0;
      local_2d0 = -1;
      local_2cc = local_45d;
      local_2c0 = local_464;
      local_2bc = uVar6;
      local_450._0_8_ = &PTR__FCDUTF8CollationIterator_003d6a60;
      local_2b8 = (ulong)local_464 << 0x20;
      local_2a8 = *(Normalizer2Impl **)(local_450._16_8_ + 0x30);
      local_2a0.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e6fd8;
      local_298._0_2_ = 2;
      local_240._16_8_ = local_450._16_8_;
      UVar7 = CollationCompare::compareUpToQuaternary
                        ((CollationIterator *)local_240,(CollationIterator *)local_450,settings,
                         local_458);
      FCDUTF8CollationIterator::~FCDUTF8CollationIterator((FCDUTF8CollationIterator *)local_450);
      FCDUTF8CollationIterator::~FCDUTF8CollationIterator((FCDUTF8CollationIterator *)local_240);
      uVar6 = local_45c;
    }
  }
  if (((UVar7 == UCOL_EQUAL) && (uVar8 = this->settings->options, 0xefff < (int)uVar8)) &&
     (*local_458 < U_ILLEGAL_ARGUMENT_ERROR)) {
    pCVar3 = this->data;
    uVar10 = 0;
    if (0 < leftLength) {
      uVar10 = local_464;
    }
    if ((uVar8 & 1) == 0) {
      local_240._24_8_ = 0xffffffff;
      local_240._0_8_ = &PTR__UObject_003d64b8;
      local_218 = (UTrie2 *)((ulong)(leftLength - uVar10) << 0x20);
      local_450._24_8_ = 0xffffffff;
      local_450._0_8_ = &PTR__UObject_003d64b8;
      local_428 = (UTrie2 *)((ulong)(uVar6 - uVar10) << 0x20);
      local_450._32_8_ = (Normalizer2Impl *)(right + (int)local_464);
      local_240._32_8_ = (Normalizer2Impl *)(left + (int)local_464);
      UVar7 = anon_unknown_16::compareNFDIter
                        (pCVar3->nfcImpl,(NFDIterator *)local_240,(NFDIterator *)local_450);
      UObject::~UObject((UObject *)local_450);
    }
    else {
      local_240._24_8_ = 0xffffffff;
      local_240._0_8_ = &PTR__FCDUTF8NFDIterator_003d6500;
      local_218 = pCVar3->trie;
      local_208 = 0;
      local_200 = local_1f0;
      local_1f8 = 0x28;
      local_1f4 = 0;
      local_b0 = 0;
      local_a8 = 0;
      local_a0 = -1;
      local_9c = 0;
      local_90.super_UObject._vptr_UObject = (UObject)((ulong)(leftLength - uVar10) << 0x20);
      local_240._32_8_ = &PTR__FCDUTF8CollationIterator_003d6a60;
      local_88._0_8_ = 0;
      local_88._16_8_ = pCVar3->nfcImpl;
      local_88._24_8_ = &PTR__UnicodeString_003e6fd8;
      local_88._32_2_ = L'\x02';
      local_450._24_8_ = 0xffffffff;
      local_450._0_8_ = &PTR__FCDUTF8NFDIterator_003d6500;
      local_428 = pCVar3->trie;
      local_418 = 0;
      local_410 = local_400;
      local_408 = 0x28;
      local_404 = 0;
      local_2c0 = 0;
      local_2b8 = 0;
      local_2b0 = -1;
      local_2ac = 0;
      local_2a0.super_UObject._vptr_UObject = (UObject)((ulong)(uVar6 - uVar10) << 0x20);
      local_450._32_8_ = &PTR__FCDUTF8CollationIterator_003d6a60;
      local_298._0_8_ = 0;
      local_298._16_8_ = pCVar3->nfcImpl;
      local_298._24_8_ = &PTR__UnicodeString_003e6fd8;
      local_298._32_2_ = L'\x02';
      local_420 = pCVar3;
      local_2a8 = (Normalizer2Impl *)(right + (int)local_464);
      local_210 = pCVar3;
      local_98 = (Normalizer2Impl *)(left + (int)local_464);
      UVar7 = anon_unknown_16::compareNFDIter
                        (pCVar3->nfcImpl,(NFDIterator *)local_240,(NFDIterator *)local_450);
      local_450._0_8_ = &PTR__FCDUTF8NFDIterator_003d6500;
      FCDUTF8CollationIterator::~FCDUTF8CollationIterator
                ((FCDUTF8CollationIterator *)(local_450 + 0x20));
      UObject::~UObject((UObject *)local_450);
      local_240._0_8_ = &PTR__FCDUTF8NFDIterator_003d6500;
      FCDUTF8CollationIterator::~FCDUTF8CollationIterator
                ((FCDUTF8CollationIterator *)(local_240 + 0x20));
    }
    UObject::~UObject((UObject *)local_240);
  }
  return UVar7;
}

Assistant:

UCollationResult
RuleBasedCollator::doCompare(const uint8_t *left, int32_t leftLength,
                             const uint8_t *right, int32_t rightLength,
                             UErrorCode &errorCode) const {
    // U_FAILURE(errorCode) checked by caller.
    if(left == right && leftLength == rightLength) {
        return UCOL_EQUAL;
    }

    // Identical-prefix test.
    int32_t equalPrefixLength = 0;
    if(leftLength < 0) {
        uint8_t c;
        while((c = left[equalPrefixLength]) == right[equalPrefixLength]) {
            if(c == 0) { return UCOL_EQUAL; }
            ++equalPrefixLength;
        }
    } else {
        for(;;) {
            if(equalPrefixLength == leftLength) {
                if(equalPrefixLength == rightLength) { return UCOL_EQUAL; }
                break;
            } else if(equalPrefixLength == rightLength ||
                      left[equalPrefixLength] != right[equalPrefixLength]) {
                break;
            }
            ++equalPrefixLength;
        }
    }
    // Back up to the start of a partially-equal code point.
    if(equalPrefixLength > 0 &&
            ((equalPrefixLength != leftLength && U8_IS_TRAIL(left[equalPrefixLength])) ||
            (equalPrefixLength != rightLength && U8_IS_TRAIL(right[equalPrefixLength])))) {
        while(--equalPrefixLength > 0 && U8_IS_TRAIL(left[equalPrefixLength])) {}
    }

    UBool numeric = settings->isNumeric();
    if(equalPrefixLength > 0) {
        UBool unsafe = FALSE;
        if(equalPrefixLength != leftLength) {
            int32_t i = equalPrefixLength;
            UChar32 c;
            U8_NEXT_OR_FFFD(left, i, leftLength, c);
            unsafe = data->isUnsafeBackward(c, numeric);
        }
        if(!unsafe && equalPrefixLength != rightLength) {
            int32_t i = equalPrefixLength;
            UChar32 c;
            U8_NEXT_OR_FFFD(right, i, rightLength, c);
            unsafe = data->isUnsafeBackward(c, numeric);
        }
        if(unsafe) {
            // Identical prefix: Back up to the start of a contraction or reordering sequence.
            UChar32 c;
            do {
                U8_PREV_OR_FFFD(left, 0, equalPrefixLength, c);
            } while(equalPrefixLength > 0 && data->isUnsafeBackward(c, numeric));
        }
        // See the notes in the UTF-16 version.

        // Pass the actual start of each string into the CollationIterators,
        // plus the equalPrefixLength position,
        // so that prefix matches back into the equal prefix work.
    }

    int32_t result;
    int32_t fastLatinOptions = settings->fastLatinOptions;
    if(fastLatinOptions >= 0 &&
            (equalPrefixLength == leftLength ||
                left[equalPrefixLength] <= CollationFastLatin::LATIN_MAX_UTF8_LEAD) &&
            (equalPrefixLength == rightLength ||
                right[equalPrefixLength] <= CollationFastLatin::LATIN_MAX_UTF8_LEAD)) {
        if(leftLength >= 0) {
            result = CollationFastLatin::compareUTF8(data->fastLatinTable,
                                                     settings->fastLatinPrimaries,
                                                     fastLatinOptions,
                                                     left + equalPrefixLength,
                                                     leftLength - equalPrefixLength,
                                                     right + equalPrefixLength,
                                                     rightLength - equalPrefixLength);
        } else {
            result = CollationFastLatin::compareUTF8(data->fastLatinTable,
                                                     settings->fastLatinPrimaries,
                                                     fastLatinOptions,
                                                     left + equalPrefixLength, -1,
                                                     right + equalPrefixLength, -1);
        }
    } else {
        result = CollationFastLatin::BAIL_OUT_RESULT;
    }

    if(result == CollationFastLatin::BAIL_OUT_RESULT) {
        if(settings->dontCheckFCD()) {
            UTF8CollationIterator leftIter(data, numeric, left, equalPrefixLength, leftLength);
            UTF8CollationIterator rightIter(data, numeric, right, equalPrefixLength, rightLength);
            result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
        } else {
            FCDUTF8CollationIterator leftIter(data, numeric, left, equalPrefixLength, leftLength);
            FCDUTF8CollationIterator rightIter(data, numeric, right, equalPrefixLength, rightLength);
            result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
        }
    }
    if(result != UCOL_EQUAL || settings->getStrength() < UCOL_IDENTICAL || U_FAILURE(errorCode)) {
        return (UCollationResult)result;
    }

    // Note: If NUL-terminated, we could get the actual limits from the iterators now.
    // That would complicate the iterators a bit, NUL-terminated strings are only a C convenience,
    // and the benefit seems unlikely to be measurable.

    // Compare identical level.
    const Normalizer2Impl &nfcImpl = data->nfcImpl;
    left += equalPrefixLength;
    right += equalPrefixLength;
    if(leftLength > 0) {
        leftLength -= equalPrefixLength;
        rightLength -= equalPrefixLength;
    }
    if(settings->dontCheckFCD()) {
        UTF8NFDIterator leftIter(left, leftLength);
        UTF8NFDIterator rightIter(right, rightLength);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    } else {
        FCDUTF8NFDIterator leftIter(data, left, leftLength);
        FCDUTF8NFDIterator rightIter(data, right, rightLength);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    }
}